

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O1

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this,cmLinkImplItem *r)

{
  pointer pcVar1;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar2;
  
  (this->super_cmLinkItem).super_string._M_dataplus._M_p =
       (pointer)&(this->super_cmLinkItem).super_string.field_2;
  pcVar1 = (r->super_cmLinkItem).super_string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (r->super_cmLinkItem).super_string._M_string_length);
  (this->super_cmLinkItem).Target = (r->super_cmLinkItem).Target;
  (this->Backtrace).Context.Name._M_dataplus._M_p = (pointer)&(this->Backtrace).Context.Name.field_2
  ;
  pcVar1 = (r->Backtrace).Context.Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Backtrace,pcVar1,pcVar1 + (r->Backtrace).Context.Name._M_string_length
            );
  (this->Backtrace).Context.Line = (r->Backtrace).Context.Line;
  pcVar2 = (r->Backtrace).Snapshot.Position.Tree;
  (this->Backtrace).Snapshot.State = (r->Backtrace).Snapshot.State;
  (this->Backtrace).Snapshot.Position.Tree = pcVar2;
  (this->Backtrace).Snapshot.Position.Position = (r->Backtrace).Snapshot.Position.Position;
  this->FromGenex = r->FromGenex;
  return;
}

Assistant:

cmLinkImplItem(cmLinkImplItem const& r):
    cmLinkItem(r), Backtrace(r.Backtrace), FromGenex(r.FromGenex) {}